

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

uint64 crnlib::pack_etc1_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 ,pack_etc1_block_context *context)

{
  bool bVar1;
  char cVar2;
  ulong *puVar3;
  undefined4 uVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  undefined2 uVar8;
  int iVar9;
  uint64 uVar10;
  color_quad_u8 *pcVar11;
  undefined2 uVar12;
  ushort *puVar14;
  ulong *puVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  int delta;
  crn_etc1_pack_params *pcVar19;
  ulong uVar20;
  byte bVar21;
  ushort uVar22;
  uint uVar23;
  long lVar24;
  crn_etc1_pack_params *ctx;
  int *piVar25;
  undefined8 uVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  byte *pbVar32;
  bool bVar33;
  ulong *puVar34;
  byte bVar35;
  long lVar36;
  ulong uVar37;
  uint *puVar38;
  undefined1 uVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  bool bVar44;
  results results [3];
  uint8 best_selectors [2] [8];
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  uint local_298;
  ulong local_288;
  ulong local_280;
  int local_274;
  uint local_26c;
  uint local_268;
  undefined4 local_264;
  etc1_block *local_260;
  color_quad_u8 *local_258;
  crn_etc1_pack_params *local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  crn_etc1_pack_params *local_230;
  ulong local_228;
  uint local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  etc1_optimizer *local_1f0;
  undefined8 local_1e8;
  ulong *local_1e0;
  ulong local_1d8;
  uint auStack_1d0 [2];
  ulong local_1c8;
  undefined1 *puStack_1c0;
  undefined1 local_1b8 [8];
  ulong local_1b0;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  undefined1 *local_198;
  ulong local_188;
  undefined4 local_180;
  uint local_17c;
  uint local_178;
  long *local_170;
  byte local_168;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 *local_140;
  ulong local_138;
  crn_etc1_pack_params local_130;
  undefined4 local_128;
  undefined8 *local_120;
  undefined1 local_118;
  crn_etc1_pack_params *local_110;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined1 local_100;
  undefined4 local_f0;
  int local_ec;
  undefined4 local_e8;
  undefined1 *local_e0 [3];
  undefined4 local_c8;
  uint local_c4;
  undefined4 local_c0;
  undefined1 *local_b8;
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  long local_88 [2];
  color_quad_u8 local_78 [18];
  uint uVar13;
  
  local_260 = dst_block;
  bVar27 = (pSrc_pixels->field_0).field_0.g;
  uVar31 = 0x10;
  while( true ) {
    uVar28 = (int)uVar31 - 1;
    uVar31 = (ulong)uVar28;
    if (((pSrc_pixels[uVar31].field_0.field_0.r != (pSrc_pixels->field_0).field_0.r) ||
        (pSrc_pixels[uVar31].field_0.field_0.g != bVar27)) ||
       (pSrc_pixels[uVar31].field_0.field_0.b != (pSrc_pixels->field_0).field_0.b)) break;
    if (uVar28 < 2) {
      uVar23 = 0xffffffff;
      local_280 = 0;
      uVar13 = 0;
      uVar28 = 0;
      uVar30 = 0;
      uVar31 = 0;
      do {
        uVar17 = (ulong)bVar27;
        uVar18 = uVar31 + 1;
        bVar27 = (pSrc_pixels->field_0).c
                 [*(uint *)(rg_etc1::
                            pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                            ::s_next_comp + uVar31 * 4 + 4)];
        iVar9 = -1;
        do {
          iVar40 = iVar9 + (uint)(pSrc_pixels->field_0).c[uVar31];
          if (0xfe < iVar40) {
            iVar40 = 0xff;
          }
          if (iVar40 < 1) {
            iVar40 = 0;
          }
          puVar14 = &g_color8_to_etc_block_config_0_255;
          if (iVar40 != 0) {
            if (iVar40 == 0xff) {
              puVar14 = &DAT_001b0dc2;
            }
            else {
              puVar14 = (ushort *)
                        (g_color8_to_etc_block_config_1_to_254 + (long)(iVar40 + -1) * 0x18);
            }
          }
          iVar40 = iVar40 - (uint)(pSrc_pixels->field_0).c[uVar31];
          uVar7 = *puVar14;
          uVar5 = uVar13;
          do {
            puVar14 = puVar14 + 1;
            uVar13 = (uint)uVar7;
            uVar29 = (uVar13 & 0xff) << 9;
            uVar7 = *(ushort *)(g_etc1_inverse_lookup + uVar17 * 2 + (ulong)uVar29);
            uVar22 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar27 * 2 + (ulong)uVar29);
            uVar42 = (uint)(uVar7 >> 8);
            uVar29 = (uint)(uVar22 >> 8);
            uVar29 = uVar29 * uVar29 + uVar42 * uVar42 + iVar40 * iVar40;
            if (uVar29 < uVar23) {
              uVar28 = uVar7 & 0xff;
              uVar30 = uVar22 & 0xff;
              if (uVar29 == 0) {
                uVar10 = 0;
                goto LAB_00190ac2;
              }
              local_280 = uVar31 & 0xffffffff;
              uVar23 = uVar29;
              uVar5 = uVar13;
            }
            uVar13 = uVar5;
            uVar7 = *puVar14;
            uVar5 = uVar13;
          } while (uVar7 != 0xffff);
          iVar9 = iVar9 + 1;
        } while (iVar9 != 2);
        uVar31 = uVar18;
      } while (uVar18 != 3);
      uVar10 = (ulong)uVar23 << 4;
      uVar31 = local_280;
LAB_00190ac2:
      (dst_block->field_0).m_bytes[3] =
           ((char)uVar13 * '\x02' & 0x1cU) * '\t' + (char)(uVar13 & 1) * '\x02';
      bVar27 = (&g_selector_index_to_etc1)[uVar13 >> 4 & 3];
      *(short *)((long)&dst_block->field_0 + 4) = (short)((int)((uint)bVar27 << 0x1e) >> 0x1f);
      *(ushort *)((long)&dst_block->field_0 + 6) = -(bVar27 & 1);
      if ((uVar13 & 1) == 0) {
        dst_block->m_low_color[(uVar31 & 0xffffffff) - 8] =
             (byte)((uVar13 >> 8) << 4) | (byte)(uVar13 >> 8);
        dst_block->m_low_color
        [(ulong)*(uint *)(rg_etc1::
                          pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                          ::s_next_comp + (uVar31 & 0xffffffff) * 4) - 8] =
             (byte)(uVar28 << 4) | (byte)uVar28;
        bVar27 = (byte)(uVar30 << 4) | (byte)uVar30;
      }
      else {
        dst_block->m_low_color[(uVar31 & 0xffffffff) - 8] = (uint8)((uVar13 >> 8) << 3);
        dst_block->m_low_color
        [(ulong)*(uint *)(rg_etc1::
                          pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                          ::s_next_comp + (uVar31 & 0xffffffff) * 4) - 8] = (byte)uVar28 << 3;
        bVar27 = (byte)uVar30 << 3;
      }
      dst_block->m_low_color
      [(ulong)*(uint *)(rg_etc1::
                        pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                        ::s_next_comp + (ulong)((int)uVar31 + 1) * 4) - 8] = bVar27;
      return uVar10;
    }
  }
  if (pack_params->m_dithering == true) {
    puVar15 = &local_1d8;
    pcVar11 = local_78;
    puVar34 = &local_1c8;
    lVar24 = 0;
    do {
      local_1c8 = 0;
      puStack_1c0 = (undefined1 *)0x0;
      local_1d8 = 0;
      auStack_1d0[0] = 0;
      auStack_1d0[1] = 0;
      lVar36 = 0;
      puVar3 = puVar15;
      do {
        puVar15 = puVar34;
        puVar34 = puVar3;
        bVar27 = (pSrc_pixels->field_0).c[lVar36];
        bVar35 = (&DAT_001e43d8)
                 [(long)((int)*puVar15 * 5 + *(int *)((long)puVar15 + 4) * 3 >> 4) + (ulong)bVar27];
        (pcVar11->field_0).c[lVar36] = bVar35;
        iVar9 = (uint)bVar27 - (uint)bVar35;
        *(int *)puVar34 = iVar9;
        bVar27 = pSrc_pixels[1].field_0.c[lVar36];
        bVar35 = (&DAT_001e43d8)
                 [(long)(*(int *)((long)puVar15 + 4) * 5 + (int)puVar15[1] * 3 + iVar9 * 7 +
                         (int)*puVar15 >> 4) + (ulong)bVar27];
        pcVar11[1].field_0.c[lVar36] = bVar35;
        iVar9 = (uint)bVar27 - (uint)bVar35;
        *(int *)((long)puVar34 + 4) = iVar9;
        bVar27 = pSrc_pixels[2].field_0.c[lVar36];
        bVar35 = (&DAT_001e43d8)
                 [(long)((int)puVar15[1] * 5 + *(int *)((long)puVar15 + 0xc) * 3 + iVar9 * 7 +
                         *(int *)((long)puVar15 + 4) >> 4) + (ulong)bVar27];
        pcVar11[2].field_0.c[lVar36] = bVar35;
        iVar9 = (uint)bVar27 - (uint)bVar35;
        *(int *)(puVar34 + 1) = iVar9;
        bVar27 = pSrc_pixels[3].field_0.c[lVar36];
        bVar35 = (&DAT_001e43d8)
                 [(long)(*(int *)((long)puVar15 + 0xc) * 5 + iVar9 * 7 + (int)puVar15[1] >> 4) +
                  (ulong)bVar27];
        pcVar11[3].field_0.c[lVar36] = bVar35;
        *(uint *)((long)puVar34 + 0xc) = (uint)bVar27 - (uint)bVar35;
        lVar36 = lVar36 + 0x10;
        puVar3 = puVar15;
      } while ((int)lVar36 != 0x40);
      lVar24 = lVar24 + 1;
      pcVar11 = (color_quad_u8 *)((long)&pcVar11->field_0 + 1);
      pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + 1);
    } while (lVar24 != 3);
    pSrc_pixels = local_78;
  }
  local_e8 = 8;
  local_e0[0] = local_a8;
  local_c0 = 8;
  local_b8 = local_a0;
  local_1c8 = CONCAT44(local_1c8._4_4_,8);
  puStack_1c0 = local_98;
  local_1a0 = 8;
  local_198 = local_90;
  local_178 = 8;
  local_170 = local_88;
  piVar16 = (int *)&local_130;
  local_130 = *pack_params;
  local_118 = 0;
  local_110 = (crn_etc1_pack_params *)
              &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_108 = 1;
  uStack_104 = 0;
  local_100 = 0;
  local_128 = 8;
  local_120 = &local_218;
  local_274 = local_ec;
  local_1f8 = (ulong)local_c4;
  local_140 = local_a8;
  pcVar19 = (crn_etc1_pack_params *)0xffffffffffffffff;
  bVar44 = false;
  local_238 = 0;
  bVar33 = false;
  local_258 = pSrc_pixels;
  local_1f0 = &context->m_optimizer;
  bVar1 = true;
LAB_0019010e:
  bVar27 = 1;
  local_298 = 0;
LAB_00190119:
  piVar16 = (int *)CONCAT71((int7)((ulong)piVar16 >> 8),1);
  uVar26 = 0;
  puVar15 = &local_1d8;
  lVar24 = 0;
  local_230 = (crn_etc1_pack_params *)0x0;
  local_250 = pcVar19;
LAB_00190135:
  local_21c = (uint)piVar16;
  if (bVar1) {
    local_218 = CONCAT44(local_218._4_4_,pSrc_pixels[lVar24 * 2].field_0.m_u32);
    local_218 = CONCAT44(pSrc_pixels[lVar24 * 2 + 4].field_0.m_u32,
                         pSrc_pixels[lVar24 * 2].field_0.m_u32);
    uStack_210 = CONCAT44(uStack_210._4_4_,pSrc_pixels[lVar24 * 2 + 8].field_0.m_u32);
    uStack_210 = CONCAT44(pSrc_pixels[lVar24 * 2 + 0xc].field_0.m_u32,
                          pSrc_pixels[lVar24 * 2 + 8].field_0.m_u32);
    local_208 = CONCAT44(local_208._4_4_,pSrc_pixels[lVar24 * 2 + 1].field_0.m_u32);
    local_208 = CONCAT44(pSrc_pixels[lVar24 * 2 + 5].field_0.m_u32,
                         pSrc_pixels[lVar24 * 2 + 1].field_0.m_u32);
    uStack_200 = CONCAT44(uStack_200._4_4_,pSrc_pixels[lVar24 * 2 + 9].field_0.m_u32);
    uStack_200 = CONCAT44(pSrc_pixels[lVar24 * 2 + 0xd].field_0.m_u32,
                          pSrc_pixels[lVar24 * 2 + 9].field_0.m_u32);
  }
  else {
    local_208 = *(undefined8 *)(pSrc_pixels + lVar24 * 8 + 4);
    uStack_200 = *(undefined8 *)(pSrc_pixels + lVar24 * 8 + 4 + 2);
    local_218 = *(undefined8 *)(pSrc_pixels + lVar24 * 8);
    uStack_210 = *(undefined8 *)(pSrc_pixels + lVar24 * 8 + 2);
  }
  local_188 = 0xffffffffffffffff;
  puVar34 = puVar15;
  uVar4 = local_158;
  if (((int)lVar24 != 0 || local_298 != 0) && local_130.m_quality != cCRNETCQualityFast) {
    local_264 = (undefined4)local_218;
    local_158 = (undefined4)local_218;
    uVar4 = local_158;
    uStack_154 = local_218._4_4_;
    uStack_150 = (undefined4)uStack_210;
    uStack_14c = uStack_210._4_4_;
    local_158._0_1_ = (char)local_218;
    local_158._1_1_ = (byte)((ulong)local_218 >> 8);
    uVar31 = 8;
    local_158._2_1_ = (char)((ulong)local_218 >> 0x10);
    do {
      uVar28 = (int)uVar31 - 1;
      uVar31 = (ulong)uVar28;
      if (((*(char *)((long)&local_218 + uVar31 * 4) != (char)local_158) ||
          (*(byte *)((long)&local_218 + uVar31 * 4 + 1) != local_158._1_1_)) ||
         (*(char *)((long)&local_218 + uVar31 * 4 + 2) != local_158._2_1_)) goto LAB_001901e8;
    } while (1 < uVar28);
    local_1e0 = puVar15;
    local_1e8 = uVar26;
    bVar35 = bVar27 & (byte)uVar26;
    puVar38 = (uint *)0x0;
    if (bVar35 != 0) {
      puVar38 = auStack_1d0;
    }
    uVar28 = 0xffffffff;
    local_288 = 1;
    local_240 = 0;
    local_26c = 0;
    local_268 = 0;
    local_248 = local_248 & 0xffffffff00000000;
    uVar31 = 0;
LAB_0019030d:
    local_138 = uVar31 + 1;
    uVar17 = (ulong)*(uint *)(rg_etc1::
                              pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + uVar31 * 4 + 4);
    uVar20 = (ulong)local_158._1_1_;
    local_158._1_1_ = *(byte *)((long)&local_264 + uVar17);
    iVar9 = -1;
    local_228 = (ulong)*(byte *)((long)&local_264 + uVar31);
    uVar18 = (ulong)*(byte *)((long)&local_264 + uVar31);
LAB_00190354:
    iVar40 = iVar9 + (int)uVar18;
    if (0xfe < iVar40) {
      iVar40 = 0xff;
    }
    if (iVar40 < 1) {
      iVar40 = 0;
    }
    puVar14 = &g_color8_to_etc_block_config_0_255;
    if (iVar40 != 0) {
      if (iVar40 == 0xff) {
        puVar14 = &DAT_001b0dc2;
      }
      else {
        puVar14 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar40 + -1) * 0x18);
      }
    }
    iVar40 = iVar40 - (int)uVar18;
    uVar7 = *puVar14;
LAB_001903aa:
    puVar14 = puVar14 + 1;
    bVar21 = (byte)uVar7;
    pcVar19 = local_250;
    pSrc_pixels = local_258;
    context = (pack_etc1_block_context *)local_1f0;
    if (bVar27 == (bVar21 & 1)) {
      uVar18 = (ulong)uVar7;
      if ((~bVar35 & 1) == 0 && (uVar7 & 1) != 0) {
        if (7 < ((uint)(uVar7 >> 8) - (uint)*(byte *)((long)puVar38 + uVar31)) + 4)
        goto LAB_001904db;
        uVar23 = (uVar7 & 0xff) << 9;
        uVar13 = (uint)*(ushort *)(g_etc1_inverse_lookup + uVar20 * 2 + (ulong)uVar23);
        if ((((uVar13 & 0xff) - (uint)*(byte *)((long)puVar38 + local_288)) + 4 < 8) &&
           (uVar22 = *(ushort *)(g_etc1_inverse_lookup + (ulong)local_158._1_1_ * 2 + (ulong)uVar23)
           , ((uVar22 & 0xff) - (uint)*(byte *)((long)puVar38 + uVar17)) + 4 < 8))
        goto LAB_00190489;
        uVar7 = *puVar14;
        uVar13 = local_268;
        uVar37 = local_240;
        goto joined_r0x00190463;
      }
      uVar13 = (uint)*(ushort *)(g_etc1_inverse_lookup + uVar20 * 2 + (ulong)bVar21 * 0x200);
      uVar22 = *(ushort *)
                (g_etc1_inverse_lookup + (ulong)local_158._1_1_ * 2 + (ulong)bVar21 * 0x200);
LAB_00190489:
      uVar39 = (undefined1)uVar22;
      uVar23 = (uint)(uVar22 >> 8) * (uint)(uVar22 >> 8) + iVar40 * iVar40 +
               (uVar13 >> 8) * (uVar13 >> 8);
      if (uVar28 <= uVar23) goto LAB_001904db;
      if (uVar23 == 0) {
        uVar28 = 0;
        uVar37 = uVar31 & 0xffffffff;
        goto LAB_001906e9;
      }
      local_248 = CONCAT44(local_248._4_4_,(uint)uVar22);
      local_240 = uVar31 & 0xffffffff;
      local_26c = (uint)uVar7;
      local_268 = uVar13;
      uVar28 = uVar23;
    }
LAB_001904db:
    uVar7 = *puVar14;
    uVar13 = local_268;
    uVar37 = local_240;
joined_r0x00190463:
    local_268 = uVar13;
    local_240 = uVar37;
    if (uVar7 == 0xffff) goto LAB_001904e9;
    goto LAB_001903aa;
  }
  goto LAB_001901e8;
LAB_001904e9:
  iVar9 = iVar9 + 1;
  uVar18 = local_228;
  if (iVar9 == 2) goto code_r0x001904fc;
  goto LAB_00190354;
code_r0x001904fc:
  uVar31 = local_138;
  local_288 = uVar17;
  if (local_138 == 3) goto code_r0x00190513;
  goto LAB_0019030d;
code_r0x00190513:
  uVar18 = (ulong)local_26c;
  uVar26 = local_1e8;
  uVar39 = (undefined1)local_248;
  if (uVar28 != 0xffffffff) {
LAB_001906e9:
    local_188 = (ulong)(uVar28 << 3);
    local_178 = 8;
    local_168 = ~(byte)uVar18 & 1;
    local_17c = (uint)(uVar18 >> 1) & 7;
    *local_170 = (ulong)((byte)((byte)uVar18 >> 4) & 3) * 0x101010101010101;
    local_158 = uVar4;
    *(char *)((long)&local_180 + uVar37) = (char)(uVar18 >> 8);
    *(char *)((long)&local_180 +
             (ulong)*(uint *)(rg_etc1::
                              pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + uVar37 * 4)) = (char)uVar13;
    *(undefined1 *)
     ((long)&local_180 +
     (ulong)*(uint *)(rg_etc1::
                      pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                      ::s_next_comp + (ulong)((int)uVar37 + 1) * 4)) = uVar39;
    uVar4 = local_158;
  }
LAB_001901e8:
  local_158 = uVar4;
  puVar15 = (ulong *)(local_1b8 + 8);
  local_118 = (undefined1)local_298;
  local_100 = ((byte)uVar26 & bVar27) != 0;
  if ((bool)local_100) {
    uStack_104 = auStack_1d0[0];
  }
  if (local_130.m_quality == cCRNETCQualitySlow) {
    local_108 = 9;
    piVar16 = pack_etc1_block::s_scan_delta_0_to_4;
  }
  else if (local_130.m_quality == cCRNETCQualityMedium) {
    local_108 = 3;
    piVar16 = pack_etc1_block::s_scan_delta_0_to_1;
  }
  else {
    local_108 = 1;
    piVar16 = pack_etc1_block::s_scan_delta_0;
  }
  ctx = &local_130;
  local_110 = (crn_etc1_pack_params *)piVar16;
  etc1_optimizer::init(&context->m_optimizer,(EVP_PKEY_CTX *)ctx);
  bVar6 = etc1_optimizer::compute(&context->m_optimizer);
  if (!bVar6) goto LAB_001907f8;
  uVar31 = *puVar34;
  piVar25 = (int *)((ulong)ctx & 0xffffffffffffff00);
  if (3000 < uVar31 && local_130.m_quality != cCRNETCQualityFast) {
    local_108 = 2;
    if (6000 < uVar31) {
      local_108 = 8;
    }
    local_110 = (crn_etc1_pack_params *)pack_etc1_block::s_scan_delta_5_to_5;
    piVar25 = pack_etc1_block::s_scan_delta_5_to_8;
    if (6000 < uVar31) {
      local_110 = (crn_etc1_pack_params *)pack_etc1_block::s_scan_delta_5_to_8;
    }
    if (local_130.m_quality == cCRNETCQualityMedium) {
      local_108 = 4;
    }
    piVar16 = pack_etc1_block::s_scan_delta_2_to_3;
    if (local_130.m_quality == cCRNETCQualityMedium) {
      local_110 = (crn_etc1_pack_params *)pack_etc1_block::s_scan_delta_2_to_3;
    }
    bVar6 = etc1_optimizer::compute(&context->m_optimizer);
    if (!bVar6) goto LAB_001907f8;
    uVar31 = *puVar34;
  }
  if (local_188 < uVar31) {
    *(undefined4 *)(puVar34 + 1) = local_180;
    *(byte *)(puVar34 + 4) = local_168;
    *(uint *)((long)puVar34 + 0xc) = local_17c;
    *puVar34 = local_188;
    piVar25 = (int *)local_170;
    memcpy((void *)puVar34[3],local_170,(ulong)local_178);
    uVar31 = *puVar34;
  }
  piVar16 = (int *)((long)&local_230->m_quality + uVar31);
  if (pcVar19 <= piVar16) goto LAB_001907f8;
  local_230 = (crn_etc1_pack_params *)piVar16;
  lVar24 = 1;
  uVar26 = CONCAT71((int7)((ulong)piVar25 >> 8),1);
  piVar16 = (int *)0x0;
  if ((local_21c & 1) == 0) goto LAB_00190774;
  goto LAB_00190135;
LAB_00190774:
  local_f0 = auStack_1d0[0];
  local_274 = auStack_1d0[1];
  memcpy(local_140,puStack_1c0,local_1c8 & 0xffffffff);
  local_c8 = local_1a8;
  local_1f8 = (ulong)local_1a4;
  memcpy(local_a0,local_198,(ulong)local_1a0);
  local_238 = (ulong)local_298;
  pcVar19 = local_230;
  bVar44 = bVar33;
LAB_001907f8:
  local_298 = 1;
  bVar6 = bVar27 == 0;
  bVar27 = 0;
  if (bVar6) goto code_r0x00190810;
  goto LAB_00190119;
code_r0x00190810:
  bVar33 = true;
  bVar6 = !bVar1;
  bVar1 = false;
  if (bVar6) goto code_r0x0019082b;
  goto LAB_0019010e;
code_r0x0019082b:
  local_250 = pcVar19;
  cVar2 = (char)local_f0;
  bVar27 = local_f0._1_1_;
  bVar35 = local_f0._2_1_;
  if ((int)local_238 != 0) {
    (local_260->field_0).m_bytes[0] = (char)local_f0 << 4 | (byte)local_c8;
    (local_260->field_0).m_bytes[1] = local_f0._1_1_ << 4 | local_c8._1_1_;
    local_c8._2_1_ = local_f0._2_1_ << 4 | local_c8._2_1_;
    goto LAB_00190919;
  }
  iVar41 = (local_c8 & 0xff) - (local_f0 & 0xff);
  iVar40 = (uint)local_c8._1_1_ - (uint)local_f0._1_1_;
  iVar43 = (uint)local_c8._2_1_ - (uint)local_f0._2_1_;
  iVar9 = iVar40;
  if (iVar41 < iVar40) {
    iVar9 = iVar41;
  }
  if (iVar43 <= iVar9) {
    iVar9 = iVar43;
  }
  if (iVar9 < -4) {
LAB_001908c5:
    crnlib_assert("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_etc.cpp"
                  ,0x6f0);
  }
  else {
    iVar9 = iVar40;
    if (iVar40 < iVar41) {
      iVar9 = iVar41;
    }
    if (iVar9 <= iVar43) {
      iVar9 = iVar43;
    }
    if (3 < iVar9) goto LAB_001908c5;
  }
  (local_260->field_0).m_bytes[0] = cVar2 << 3 | (char)iVar41 + (char)(iVar41 >> 0x1f) * -8;
  (local_260->field_0).m_bytes[1] = bVar27 << 3 | (char)iVar40 + (char)(iVar40 >> 0x1f) * -8;
  local_c8._2_1_ = bVar35 << 3 | (char)iVar43 + (char)(iVar43 >> 0x1f) * -8;
LAB_00190919:
  (local_260->field_0).m_bytes[2] = local_c8._2_1_;
  (local_260->field_0).m_bytes[3] =
       (((char)local_238 * '\x02' & 2U) + (char)local_1f8 * '\x04' | (byte)(local_274 << 5)) ^ 2 |
       bVar44;
  if (bVar44) {
    uVar28 = 0;
    lVar24 = 7;
    uVar13 = 0;
    do {
      uVar13 = (byte)(&g_selector_index_to_etc1)[(byte)local_e0[0][lVar24 + -4]] & 1 |
               ((byte)(&g_selector_index_to_etc1)[(byte)local_b8[lVar24 + -4]] & 1 |
               ((uint)(byte)(&g_selector_index_to_etc1)[(byte)local_b8[lVar24]] * 2 & 2) +
               uVar13 * 4) * 4 +
               ((byte)(&g_selector_index_to_etc1)[(byte)local_e0[0][lVar24]] & 1) * 2;
      uVar12 = (undefined2)uVar13;
      uVar28 = (uint)((byte)(&g_selector_index_to_etc1)[(byte)local_e0[0][lVar24 + -4]] >> 1) |
               (byte)(&g_selector_index_to_etc1)[(byte)local_e0[0][lVar24]] & 0xfffffffe |
               ((byte)(&g_selector_index_to_etc1)[(byte)local_b8[lVar24 + -4]] & 0xfffffffe |
                uVar28 << 3 |
               (uint)(byte)(&g_selector_index_to_etc1)[(byte)local_b8[lVar24]] * 2 & 0xfffffffc) * 2
      ;
      uVar8 = (undefined2)uVar28;
      lVar24 = lVar24 + -1;
    } while (lVar24 != 3);
  }
  else {
    uVar28 = 0;
    lVar24 = 1;
    uVar13 = 0;
    do {
      pbVar32 = local_e0[lVar24 * 5] + 7;
      bVar44 = true;
      do {
        bVar33 = bVar44;
        uVar13 = (byte)(&g_selector_index_to_etc1)[pbVar32[-3]] & 1 |
                 ((byte)(&g_selector_index_to_etc1)[pbVar32[-1]] & 1 |
                 ((uint)(byte)(&g_selector_index_to_etc1)[*pbVar32] * 2 & 2) + uVar13 * 4) * 4 +
                 ((byte)(&g_selector_index_to_etc1)[pbVar32[-2]] & 1) * 2;
        uVar12 = (undefined2)uVar13;
        uVar28 = (uint)((byte)(&g_selector_index_to_etc1)[pbVar32[-3]] >> 1) |
                 (byte)(&g_selector_index_to_etc1)[pbVar32[-2]] & 0xfffffffe |
                 ((byte)(&g_selector_index_to_etc1)[pbVar32[-1]] & 0xfffffffe | uVar28 << 3 |
                 (uint)(byte)(&g_selector_index_to_etc1)[*pbVar32] * 2 & 0xfffffffc) * 2;
        uVar8 = (undefined2)uVar28;
        pbVar32 = pbVar32 + -4;
        bVar44 = false;
      } while (bVar33);
      bVar44 = lVar24 != 0;
      lVar24 = lVar24 + -1;
    } while (bVar44);
  }
  (local_260->field_0).m_bytes[4] = (uint8)((ushort)uVar8 >> 8);
  (local_260->field_0).m_bytes[5] = (uint8)uVar8;
  (local_260->field_0).m_bytes[6] = (uint8)((ushort)uVar12 >> 8);
  (local_260->field_0).m_bytes[7] = (uint8)uVar12;
  return (uint64)local_250;
}

Assistant:

uint64 pack_etc1_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params, pack_etc1_block_context& context)
    {
        color_quad_u8 src_pixel0(pSrc_pixels[0]);

        int r;
        for (r = 15; r >= 1; --r)
        {
            if ((pSrc_pixels[r].r != src_pixel0.r) || (pSrc_pixels[r].g != src_pixel0.g) || (pSrc_pixels[r].b != src_pixel0.b))
            {
                break;
            }
        }
        if (!r)
        {
            return 16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r, pack_params, context);
        }

        color_quad_u8 dithered_pixels[16];
        if (pack_params.m_dithering)
        {
            DitherBlock(dithered_pixels, pSrc_pixels);
            pSrc_pixels = dithered_pixels;
        }

        uint64 best_error = cUINT64_MAX;
        uint best_flip = false, best_use_color4 = false;

        uint8 best_selectors[2][8];
        etc1_optimizer::results best_results[2];
        for (uint i = 0; i < 2; i++)
        {
            best_results[i].m_n = 8;
            best_results[i].m_pSelectors = best_selectors[i];
        }

        uint8 selectors[3][8];
        etc1_optimizer::results results[3];

        for (uint i = 0; i < 3; i++)
        {
            results[i].m_n = 8;
            results[i].m_pSelectors = selectors[i];
        }

        color_quad_u8 subblock_pixels[8];

        etc1_optimizer::params params(pack_params);
        params.m_num_src_pixels = 8;
        params.m_pSrc_pixels = subblock_pixels;

        for (uint flip = 0; flip < 2; flip++)
        {
            for (uint use_color4 = 0; use_color4 < 2; use_color4++)
            {
                uint64 trial_error = 0;

                uint subblock;
                for (subblock = 0; subblock < 2; subblock++)
                {
                    if (flip)
                    {
                        memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
                    }
                    else
                    {
                        const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
                        subblock_pixels[0] = pSrc_col[0];
                        subblock_pixels[1] = pSrc_col[4];
                        subblock_pixels[2] = pSrc_col[8];
                        subblock_pixels[3] = pSrc_col[12];
                        subblock_pixels[4] = pSrc_col[1];
                        subblock_pixels[5] = pSrc_col[5];
                        subblock_pixels[6] = pSrc_col[9];
                        subblock_pixels[7] = pSrc_col[13];
                    }

                    results[2].m_error = cUINT64_MAX;
                    if ((params.m_quality >= cCRNETCQualityMedium) && ((subblock) || (use_color4)))
                    {
                        color_quad_u8 subblock_pixel0(subblock_pixels[0]);
                        for (r = 7; r >= 1; --r)
                        {
                            if ((subblock_pixels[r].r != subblock_pixel0.r) || (subblock_pixels[r].g != subblock_pixel0.g) || (subblock_pixels[r].b != subblock_pixel0.b))
                            {
                                break;
                            }
                        }
                        if (!r)
                        {
                            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixel0.r, pack_params, context, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : nullptr);
                        }
                    }

                    params.m_use_color4 = (use_color4 != 0);
                    params.m_constrain_against_base_color5 = false;

                    if ((!use_color4) && (subblock))
                    {
                        params.m_constrain_against_base_color5 = true;
                        params.m_base_color5 = results[0].m_block_color_unscaled;
                    }

                    if (params.m_quality == cCRNETCQualitySlow)
                    {
                        static const int s_scan_delta_0_to_4[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_4);
                        params.m_pScan_deltas = s_scan_delta_0_to_4;
                    }
                    else if (params.m_quality == cCRNETCQualityMedium)
                    {
                        static const int s_scan_delta_0_to_1[] = { -1, 0, 1 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_1);
                        params.m_pScan_deltas = s_scan_delta_0_to_1;
                    }
                    else
                    {
                        static const int s_scan_delta_0[] = { 0 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0);
                        params.m_pScan_deltas = s_scan_delta_0;
                    }

                    context.m_optimizer.init(params, results[subblock]);

                    if (!context.m_optimizer.compute())
                    {
                        break;
                    }

                    // Fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
                    const uint refinement_error_thresh0 = 3000;
                    const uint refinement_error_thresh1 = 6000;
                    if ((params.m_quality >= cCRNETCQualityMedium) && (results[subblock].m_error > refinement_error_thresh0))
                    {
                        if (params.m_quality == cCRNETCQualityMedium)
                        {
                            static const int s_scan_delta_2_to_3[] = { -3, -2, 2, 3 };
                            params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_2_to_3);
                            params.m_pScan_deltas = s_scan_delta_2_to_3;
                        }
                        else
                        {
                            static const int s_scan_delta_5_to_5[] = { -5, 5 };
                            static const int s_scan_delta_5_to_8[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
                            if (results[subblock].m_error > refinement_error_thresh1)
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_8);
                                params.m_pScan_deltas = s_scan_delta_5_to_8;
                            }
                            else
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_5);
                                params.m_pScan_deltas = s_scan_delta_5_to_5;
                            }
                        }

                        if (!context.m_optimizer.compute())
                        {
                            break;
                        }
                    }

                    if (results[2].m_error < results[subblock].m_error)
                    {
                        results[subblock] = results[2];
                    }

                    trial_error += results[subblock].m_error;
                    if (trial_error >= best_error)
                    {
                        break;
                    }
                }

                if (subblock < 2)
                {
                    continue;
                }

                best_error = trial_error;
                best_results[0] = results[0];
                best_results[1] = results[1];
                best_flip = flip;
                best_use_color4 = use_color4;

            } // use_color4

        } // flip

        int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
        int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
        int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
        if (!best_use_color4)
        {
            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                // Shouldn't ever happen
                CRNLIB_VERIFY(0);
            }
        }

        if (best_use_color4)
        {
            dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
            dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
            dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
        }
        else
        {
            if (dr < 0)
            {
                dr += 8;
            }
            if (dg < 0)
            {
                dg += 8;
            }
            if (db < 0)
            {
                db += 8;
            }
            dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
            dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
            dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
        }

        dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

        uint selector0 = 0, selector1 = 0;
        if (best_flip)
        {
            // flipped:
            // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
            // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
            //
            // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
            // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
            const uint8* pSelectors0 = best_results[0].m_pSelectors;
            const uint8* pSelectors1 = best_results[1].m_pSelectors;
            for (int x = 3; x >= 0; --x)
            {
                uint b;
                b = g_selector_index_to_etc1[pSelectors1[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors1[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);
            }
        }
        else
        {
            // non-flipped:
            // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
            // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
            //
            // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
            // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
            for (int subblock = 1; subblock >= 0; --subblock)
            {
                const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
                for (uint i = 0; i < 2; i++)
                {
                    uint b;
                    b = g_selector_index_to_etc1[pSelectors[3]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[2]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[1]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[0]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    pSelectors -= 4;
                }
            }
        }

        dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
        dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
        dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
        dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

        return best_error;
    }